

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

BasicBlock * __thiscall
FlowGraph::InsertCompensationCodeForBlockMove
          (FlowGraph *this,FlowEdge *edge,bool insertToLoopList,bool sinkBlockLoop,bool afterForward
          )

{
  uint num;
  BasicBlock *pBVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  BasicBlock *this_00;
  BasicBlock *this_01;
  BasicBlock *targetBlock;
  Instr *this_02;
  BasicBlock *pBVar5;
  Instr *this_03;
  LabelInstr *branchTarget;
  LabelInstr *this_04;
  BranchInstr *pBVar6;
  undefined4 *puVar7;
  MultiBranchInstr *this_05;
  Region *region;
  bool local_82;
  bool local_81;
  bool assignRegionsBeforeGlobopt;
  bool replaced;
  BranchInstr *sourceBr;
  BranchInstr *compBr;
  LabelInstr *compLabel;
  Func *sinkLabelFunc;
  LabelInstr *sinkLabel;
  Instr *sourceLastInstr;
  BasicBlock *fallthroughBlock;
  BasicBlock *sinkBlock;
  BasicBlock *sourceBlock;
  BasicBlock *compBlock;
  bool afterForward_local;
  bool sinkBlockLoop_local;
  bool insertToLoopList_local;
  FlowEdge *edge_local;
  FlowGraph *this_local;
  
  this_00 = BasicBlock::New(this);
  this_01 = FlowEdge::GetPred(edge);
  targetBlock = FlowEdge::GetSucc(edge);
  pBVar1 = this_01->next;
  this_02 = BasicBlock::GetLastInstr(this_01);
  num = this->blockCount;
  this->blockCount = num + 1;
  BasicBlock::SetBlockNum(this_00,num);
  if (insertToLoopList) {
    if (sinkBlockLoop) {
      if ((targetBlock->loop == (Loop *)0x0) ||
         (pBVar5 = Loop::GetHeadBlock(targetBlock->loop), pBVar5 != targetBlock)) {
        this_00->loop = targetBlock->loop;
        InsertCompBlockToLoopList(this,this_00->loop,this_00,targetBlock,false);
      }
      else {
        this_00->loop = targetBlock->loop->parent;
        InsertCompBlockToLoopList(this,this_00->loop,this_00,targetBlock,false);
      }
      *(ushort *)&this_00->field_0x18 = *(ushort *)&this_00->field_0x18 & 0xfbff | 0x400;
    }
    else {
      this_00->loop = this_01->loop;
      InsertCompBlockToLoopList(this,this_00->loop,this_00,this_01,true);
      *(ushort *)&this_00->field_0x18 = *(ushort *)&this_00->field_0x18 & 0xf7ff | 0x800;
    }
  }
  this_00->next = pBVar1;
  pBVar1->prev = this_00;
  this_00->prev = this_01;
  this_01->next = this_00;
  BasicBlock::RemoveSucc(this_01,targetBlock,this,false,false);
  AddEdge(this,this_01,this_00);
  FlowEdge::SetPred(edge,this_00);
  BasicBlock::AddSucc(this_00,edge,this);
  this_03 = BasicBlock::GetFirstInstr(targetBlock);
  branchTarget = IR::Instr::AsLabelInstr(this_03);
  func = (branchTarget->super_Instr).m_func;
  this_04 = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(this_02,&this_04->super_Instr);
  BasicBlock::SetFirstInstr(this_00,&this_04->super_Instr);
  IR::LabelInstr::SetBasicBlock(this_04,this_00);
  pBVar6 = IR::BranchInstr::New(Br,branchTarget,func);
  IR::Instr::SetByteCodeOffset(&pBVar6->super_Instr,&branchTarget->super_Instr);
  IR::Instr::InsertAfter(&this_04->super_Instr,&pBVar6->super_Instr);
  BasicBlock::SetLastInstr(this_00,&pBVar6->super_Instr);
  IR::Instr::SetByteCodeOffset(&this_04->super_Instr,&branchTarget->super_Instr);
  bVar3 = IR::Instr::IsBranchInstr(this_02);
  if (bVar3) {
    pBVar6 = IR::Instr::AsBranchInstr(this_02);
    bVar3 = IR::BranchInstr::IsMultiBranch(pBVar6);
    if ((!bVar3) && (bVar3 = IR::BranchInstr::IsConditional(pBVar6), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x945,"(sourceBr->IsMultiBranch() || sourceBr->IsConditional())",
                         "sourceBr->IsMultiBranch() || sourceBr->IsConditional()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = IR::BranchInstr::IsMultiBranch(pBVar6);
    if (bVar3) {
      this_05 = IR::BranchInstr::AsMultiBrInstr(pBVar6);
      bVar3 = IR::MultiBranchInstr::ReplaceTarget(this_05,branchTarget,this_04);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x949,"(replaced)","replaced");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  if (afterForward) {
    region = IR::LabelInstr::GetRegion(branchTarget);
    IR::LabelInstr::SetRegion(this_04,region);
  }
  else {
    BVar4 = Func::HasTry(this->func);
    local_81 = false;
    if (BVar4 != 0) {
      bVar3 = Func::DoOptimizeTry(this->func);
      local_82 = true;
      if ((!bVar3) &&
         ((bVar3 = Func::IsSimpleJit(this->func), !bVar3 ||
          (local_82 = true, (*(uint *)&this->func->field_0x240 >> 4 & 1) == 0)))) {
        local_82 = Func::IsLoopBodyInTryFinally(this->func);
      }
      local_81 = local_82;
    }
    if (local_81 != false) {
      UpdateRegionForBlock(this,this_00);
    }
  }
  return this_00;
}

Assistant:

BasicBlock *
FlowGraph::InsertCompensationCodeForBlockMove(FlowEdge * edge,  bool insertToLoopList /*=false*/, bool sinkBlockLoop /*=false*/, bool afterForward /*=false*/)
{
    BasicBlock * compBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();
    BasicBlock * fallthroughBlock = sourceBlock->next;
    IR::Instr *  sourceLastInstr = sourceBlock->GetLastInstr();

    compBlock->SetBlockNum(this->blockCount++);

    if (insertToLoopList)
    {
        // For flow graph edits in
        if (sinkBlockLoop)
        {
            if (sinkBlock->loop && sinkBlock->loop->GetHeadBlock() == sinkBlock)
            {
                // BLUE 531255: sinkblock may be the head block of new loop, we shouldn't insert compensation block to that loop
                // Insert it to all the parent loop lists.
                compBlock->loop = sinkBlock->loop->parent;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false);
            }
            else
            {
                compBlock->loop = sinkBlock->loop;
                InsertCompBlockToLoopList(compBlock->loop, compBlock, sinkBlock, false); // sinkBlock or fallthroughBlock?
            }
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSink = true;
#endif
        }
        else
        {
            compBlock->loop = sourceBlock->loop;
            InsertCompBlockToLoopList(compBlock->loop, compBlock, sourceBlock, true);
#ifdef DBG
            compBlock->isBreakCompensationBlockAtSource = true;
#endif
        }
    }

    //
    // Fixup block linkage
    //

    // compensation block is inserted right after sourceBlock
    compBlock->next = fallthroughBlock;
    fallthroughBlock->prev = compBlock;

    compBlock->prev = sourceBlock;
    sourceBlock->next = compBlock;

    //
    // Fixup flow edges
    //
    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, compBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(compBlock);
    compBlock->AddSucc(edge, this);

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *compLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);
    sourceLastInstr->InsertAfter(compLabel);
    compBlock->SetFirstInstr(compLabel);
    compLabel->SetBasicBlock(compBlock);

    // Add br to sinkBlock from compensation block
    IR::BranchInstr *compBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    compBr->SetByteCodeOffset(sinkLabel);
    compLabel->InsertAfter(compBr);
    compBlock->SetLastInstr(compBr);

    compLabel->SetByteCodeOffset(sinkLabel);

    // Fixup flow out of sourceBlock
    if (sourceLastInstr->IsBranchInstr())
    {
        IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
        Assert(sourceBr->IsMultiBranch() || sourceBr->IsConditional());
        if (sourceBr->IsMultiBranch())
        {
            const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, compLabel);
            Assert(replaced);
        }
    }

    if (!afterForward)
    {
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
            (this->func->IsSimpleJit() && this->func->hasBailout) ||
            this->func->IsLoopBodyInTryFinally());

        if (assignRegionsBeforeGlobopt)
        {
            UpdateRegionForBlock(compBlock);
        }
    }
    else
    {
        compLabel->SetRegion(sinkLabel->GetRegion());
    }

    return compBlock;
}